

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

string * __thiscall
supermap::Supermap<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>::addRandomString
          (Supermap<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long> *this,string *s,
          size_t len)

{
  undefined1 auVar1 [16];
  result_type rVar2;
  ulong in_RCX;
  string *in_RDX;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_RDI;
  size_t i;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  undefined8 local_28;
  
  this_00 = in_RDI;
  std::__cxx11::string::operator+=(in_RDX,'-');
  for (local_28 = 0; local_28 < in_RCX; local_28 = local_28 + 1) {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rVar2;
    std::__cxx11::string::operator+=(in_RDX,SUB161(auVar1 % ZEXT816(0x1a),0) + 'a');
  }
  std::__cxx11::string::string((string *)this_00,in_RDX);
  return (string *)in_RDI;
}

Assistant:

[[nodiscard]] std::string addRandomString(std::string s, std::size_t len = 8) const {
        assert(len != 0);
        s += '-';
        for (std::size_t i = 0; i < len; ++i) {
            s += static_cast<char>(random() % ('z' - 'a' + 1) + 'a');
        }
        return s;
    }